

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O0

uint andyzip::brotli_decoder::read_window_size(brotli_decoder_state *s)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  uint local_28;
  int w47;
  int w13;
  int w0;
  brotli_decoder_state *s_local;
  
  sVar1 = brotli_decoder_state::read(s,1,in_RDX,in_RCX);
  if (s->error == ok) {
    if ((int)sVar1 == 0) {
      s_local._4_4_ = 0x10;
    }
    else {
      sVar1 = brotli_decoder_state::read(s,3,__buf,in_RCX);
      if (s->error == ok) {
        if ((int)sVar1 == 0) {
          sVar1 = brotli_decoder_state::read(s,4,__buf_00,in_RCX);
          if (s->error == ok) {
            if ((int)sVar1 == 0) {
              local_28 = 0x11;
            }
            else {
              local_28 = (int)sVar1 + 8;
            }
            s_local._4_4_ = local_28;
          }
          else {
            s_local._4_4_ = 0;
          }
        }
        else {
          s_local._4_4_ = (int)sVar1 + 0x11;
        }
      }
      else {
        s_local._4_4_ = 0;
      }
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static unsigned read_window_size(brotli_decoder_state &s) {
      auto w0 = s.read(1);
      if (s.error != error_code::ok) return 0; 
      if (w0 == 0) {
        return 16;
      }

      auto w13 = s.read(3);
      if (s.error != error_code::ok) return 0; 
      if (w13 != 0) {
        return w13 + 17;
      }

      auto w47 = s.read(4);
      if (s.error != error_code::ok) return 0; 

      return w47 ? w47 + 10 - 2 : 17;
    }